

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_ext_key_share_parse_clienthello
               (SSL_HANDSHAKE *hs,bool *out_found,Span<const_unsigned_char> *out_peer_key,
               uint8_t *out_alert,SSL_CLIENT_HELLO *client_hello)

{
  uint16_t uVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  uint16_t id;
  CBS key_shares;
  CBS peer_key_tmp;
  CBS contents;
  uint16_t local_72;
  uchar *local_70;
  bool *local_68;
  CBS local_60;
  CBS local_50;
  CBS local_40;
  
  bVar2 = ssl_client_hello_get_extension(client_hello,&local_40,0x33);
  if (bVar2) {
    iVar3 = CBS_get_u16_length_prefixed(&local_40,&local_60);
    if ((iVar3 == 0) || (local_40.len != 0)) {
      bVar2 = false;
      iVar3 = 0x92f;
LAB_00136010:
      ERR_put_error(0x10,0,0x89,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                    ,iVar3);
    }
    else {
      bVar2 = local_60.len == 0;
      local_68 = out_found;
      if (bVar2) {
        sVar4 = 0;
        local_70 = (uchar *)0x0;
      }
      else {
        uVar1 = ((hs->new_session)._M_t.
                 super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                 super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                 super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl)->group_id;
        local_70 = (uchar *)0x0;
        sVar4 = 0;
        do {
          iVar3 = CBS_get_u16(&local_60,&local_72);
          if (((iVar3 == 0) ||
              (iVar3 = CBS_get_u16_length_prefixed(&local_60,&local_50), iVar3 == 0)) ||
             (local_50.len == 0)) {
            iVar3 = 0x93d;
            goto LAB_00136010;
          }
          if (local_72 == uVar1) {
            if (sVar4 != 0) {
              ERR_put_error(0x10,0,0x108,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                            ,0x943);
              *out_alert = '/';
              return bVar2;
            }
            local_70 = local_50.data;
            sVar4 = local_50.len;
          }
          bVar2 = local_60.len == 0;
        } while (!bVar2);
      }
      if (out_peer_key != (Span<const_unsigned_char> *)0x0) {
        out_peer_key->data_ = local_70;
        out_peer_key->size_ = sVar4;
      }
      *local_68 = sVar4 != 0;
    }
  }
  else {
    bVar2 = false;
    ERR_put_error(0x10,0,0x102,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x927);
    *out_alert = 'm';
  }
  return bVar2;
}

Assistant:

bool ssl_ext_key_share_parse_clienthello(SSL_HANDSHAKE *hs, bool *out_found,
                                         Span<const uint8_t> *out_peer_key,
                                         uint8_t *out_alert,
                                         const SSL_CLIENT_HELLO *client_hello) {
  // We only support connections that include an ECDHE key exchange, or use a
  // PAKE.
  CBS contents;
  if (!ssl_client_hello_get_extension(client_hello, &contents,
                                      TLSEXT_TYPE_key_share)) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_MISSING_KEY_SHARE);
    *out_alert = SSL_AD_MISSING_EXTENSION;
    return false;
  }

  CBS key_shares;
  if (!CBS_get_u16_length_prefixed(&contents, &key_shares) ||
      CBS_len(&contents) != 0) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  // Find the corresponding key share.
  const uint16_t group_id = hs->new_session->group_id;
  CBS peer_key;
  CBS_init(&peer_key, nullptr, 0);
  while (CBS_len(&key_shares) > 0) {
    uint16_t id;
    CBS peer_key_tmp;
    if (!CBS_get_u16(&key_shares, &id) ||
        !CBS_get_u16_length_prefixed(&key_shares, &peer_key_tmp) ||
        CBS_len(&peer_key_tmp) == 0) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
      return false;
    }

    if (id == group_id) {
      if (CBS_len(&peer_key) != 0) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DUPLICATE_KEY_SHARE);
        *out_alert = SSL_AD_ILLEGAL_PARAMETER;
        return false;
      }

      peer_key = peer_key_tmp;
      // Continue parsing the structure to keep peers honest.
    }
  }

  if (out_peer_key != nullptr) {
    *out_peer_key = peer_key;
  }
  *out_found = CBS_len(&peer_key) != 0;
  return true;
}